

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O0

set_entry * set_search(set *ht,uint32_t hash,void *key)

{
  uint32_t d;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  set_entry *entry_00;
  set_entry *entry;
  uint32_t hash_address;
  uint32_t double_hash;
  uint32_t start_address;
  uint32_t size;
  void *key_local;
  uint32_t hash_local;
  set *ht_local;
  
  _Var1 = key_pointer_is_reserved(key);
  if (_Var1) {
    __assert_fail("!key_pointer_is_reserved(key)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/set.c"
                  ,0xdf,"struct set_entry *set_search(const struct set *, uint32_t, const void *)");
  }
  d = ht->size;
  uVar2 = util_fast_urem32(hash,d,ht->size_magic);
  uVar3 = util_fast_urem32(hash,ht->rehash,ht->rehash_magic);
  entry._0_4_ = uVar2;
  while( true ) {
    entry_00 = ht->table + (uint32_t)entry;
    iVar4 = entry_is_free(entry_00);
    if (iVar4 != 0) {
      return (set_entry *)0x0;
    }
    iVar4 = entry_is_present(entry_00);
    if (((iVar4 != 0) && (entry_00->hash == hash)) &&
       (_Var1 = (*ht->key_equals_function)(key,entry_00->key), _Var1)) break;
    entry._0_4_ = uVar3 + 1 + (uint32_t)entry;
    if (d <= (uint32_t)entry) {
      entry._0_4_ = (uint32_t)entry - d;
    }
    if ((uint32_t)entry == uVar2) {
      return (set_entry *)0x0;
    }
  }
  return entry_00;
}

Assistant:

static struct set_entry *
set_search(const struct set *ht, uint32_t hash, const void *key)
{
   assert(!key_pointer_is_reserved(key));

   uint32_t size = ht->size;
   uint32_t start_address = util_fast_urem32(hash, size, ht->size_magic);
   uint32_t double_hash = util_fast_urem32(hash, ht->rehash,
                                           ht->rehash_magic) + 1;
   uint32_t hash_address = start_address;
   do {
      struct set_entry *entry = ht->table + hash_address;

      if (entry_is_free(entry)) {
         return NULL;
      } else if (entry_is_present(entry) && entry->hash == hash) {
         if (ht->key_equals_function(key, entry->key)) {
            return entry;
         }
      }

      hash_address += double_hash;
      if (hash_address >= size)
         hash_address -= size;
   } while (hash_address != start_address);

   return NULL;
}